

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeMatrB
          (ChElementHexaCorot_20 *this,ChMatrixDynamic<> *MatrB,double zeta1,double zeta2,
          double zeta3,double *JacobianDet)

{
  Scalar SVar1;
  Scalar *pSVar2;
  undefined4 uVar3;
  Scalar SVar4;
  ChMatrixDynamic<> Btemp;
  ChMatrixDynamic<> Jinv;
  ChMatrixDynamic<> J1;
  ChMatrixDynamic<> Jacobian;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_50;
  double local_40;
  double local_38;
  double local_30;
  
  uVar3 = 3;
  Jinv.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data._0_4_ =
       uVar3;
  J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data._0_4_ = uVar3
  ;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&Jacobian,(int *)&J1,(int *)&Jinv);
  Btemp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)
       CONCAT44(Btemp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                m_data._4_4_,0x14);
  Jinv.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data._0_4_ =
       uVar3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&J1,(int *)&Jinv,(int *)&Btemp);
  local_40 = zeta1;
  local_38 = zeta2;
  local_30 = zeta3;
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xc])(this,&Jacobian,&J1);
  SVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&Jacobian);
  *JacobianDet = SVar4;
  Btemp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)
       Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::inverse
                 ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&Jacobian);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&Jinv,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)&Btemp);
  local_50 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&Jinv,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&J1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&Btemp,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
              *)&local_50);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,0x3c);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,3);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,6);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,9);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0xc);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0xf);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x12);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x15);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x18);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x1b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x1e);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x21);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x24);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x27);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x2a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x2d);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x30);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x33);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x36);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,0,0x39);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,1);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,4);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,7);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,10);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0xd);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x10);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x13);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x16);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x19);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x1c);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x1f);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x22);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x25);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x28);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x2b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x2e);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x31);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x34);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x37);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,1,0x3a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,2);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,5);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,8);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0xb);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0xe);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x11);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x14);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x17);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x1a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x1d);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x20);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x23);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x26);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x29);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x2c);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x2f);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x32);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x35);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x38);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,2,0x3b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,1);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,3);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,4);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,6);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,7);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,9);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,10);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0xc);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0xd);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0xf);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x10);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x12);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x13);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x15);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x16);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x18);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x19);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x1b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x1c);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x1e);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x1f);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x21);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x22);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x24);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x25);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x27);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x28);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x2a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x2b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x2d);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x2e);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x30);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x31);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x33);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x34);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x36);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x37);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x39);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,3,0x3a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,1);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,2);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,4);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,5);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,7);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,8);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,10);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0xb);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0xd);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0xe);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x10);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x11);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x13);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x14);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x16);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x17);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x19);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x1a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x1c);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x1d);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x1f);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x20);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x22);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x23);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x25);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x26);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x28);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x29);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x2b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x2c);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x2e);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x2f);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x31);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x32);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x34);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x35);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x37);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x38);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x3a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,1,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,4,0x3b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,2);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,3);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,5);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,6);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,8);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,9);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0xb);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0xc);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0xe);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0xf);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x11);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x12);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x14);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x15);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x17);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x18);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x1a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x1b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x1d);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x1e);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,10);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x20);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x21);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x23);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x24);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x26);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x27);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x29);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x2a);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xe);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x2c);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x2d);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0xf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x2f);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x30);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x10)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x32);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x33);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x11)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x35);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x36);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x12)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x38);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,2,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x39);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Btemp,0,0x13)
  ;
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)MatrB,5,0x3b);
  *pSVar2 = SVar1;
  Eigen::internal::handmade_aligned_free
            (Btemp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
            );
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(Jinv.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data._4_4_,
                              Jinv.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data._0_4_));
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data._4_4_,
                              J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data._0_4_));
  Eigen::internal::handmade_aligned_free
            (Jacobian.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementHexaCorot_20::ComputeMatrB(ChMatrixDynamic<>& MatrB,
                                         double zeta1,
                                         double zeta2,
                                         double zeta3,
                                         double& JacobianDet) {
    ChMatrixDynamic<> Jacobian(3, 3);
    ChMatrixDynamic<> J1(3, 20);
    ComputeJacobian(Jacobian, J1, ChVector<>(zeta1, zeta2, zeta3));

    // !!! store the Jacobian Determinant: needed for the integration
    JacobianDet = Jacobian.determinant();

    ChMatrixDynamic<> Jinv = Jacobian.inverse();
    ChMatrixDynamic<> Btemp = Jinv * J1;
    MatrB.setZero(6, 60);  // Remember to resize the matrix!

    MatrB(0, 0) = Btemp(0, 0);
    MatrB(0, 3) = Btemp(0, 1);
    MatrB(0, 6) = Btemp(0, 2);
    MatrB(0, 9) = Btemp(0, 3);
    MatrB(0, 12) = Btemp(0, 4);
    MatrB(0, 15) = Btemp(0, 5);
    MatrB(0, 18) = Btemp(0, 6);
    MatrB(0, 21) = Btemp(0, 7);
    MatrB(0, 24) = Btemp(0, 8);
    MatrB(0, 27) = Btemp(0, 9);
    MatrB(0, 30) = Btemp(0, 10);
    MatrB(0, 33) = Btemp(0, 11);
    MatrB(0, 36) = Btemp(0, 12);
    MatrB(0, 39) = Btemp(0, 13);
    MatrB(0, 42) = Btemp(0, 14);
    MatrB(0, 45) = Btemp(0, 15);
    MatrB(0, 48) = Btemp(0, 16);
    MatrB(0, 51) = Btemp(0, 17);
    MatrB(0, 54) = Btemp(0, 18);
    MatrB(0, 57) = Btemp(0, 19);

    MatrB(1, 1) = Btemp(1, 0);
    MatrB(1, 4) = Btemp(1, 1);
    MatrB(1, 7) = Btemp(1, 2);
    MatrB(1, 10) = Btemp(1, 3);
    MatrB(1, 13) = Btemp(1, 4);
    MatrB(1, 16) = Btemp(1, 5);
    MatrB(1, 19) = Btemp(1, 6);
    MatrB(1, 22) = Btemp(1, 7);
    MatrB(1, 25) = Btemp(1, 8);
    MatrB(1, 28) = Btemp(1, 9);
    MatrB(1, 31) = Btemp(1, 10);
    MatrB(1, 34) = Btemp(1, 11);
    MatrB(1, 37) = Btemp(1, 12);
    MatrB(1, 40) = Btemp(1, 13);
    MatrB(1, 43) = Btemp(1, 14);
    MatrB(1, 46) = Btemp(1, 15);
    MatrB(1, 49) = Btemp(1, 16);
    MatrB(1, 52) = Btemp(1, 17);
    MatrB(1, 55) = Btemp(1, 18);
    MatrB(1, 58) = Btemp(1, 19);

    MatrB(2, 2) = Btemp(2, 0);
    MatrB(2, 5) = Btemp(2, 1);
    MatrB(2, 8) = Btemp(2, 2);
    MatrB(2, 11) = Btemp(2, 3);
    MatrB(2, 14) = Btemp(2, 4);
    MatrB(2, 17) = Btemp(2, 5);
    MatrB(2, 20) = Btemp(2, 6);
    MatrB(2, 23) = Btemp(2, 7);
    MatrB(2, 26) = Btemp(2, 8);
    MatrB(2, 29) = Btemp(2, 9);
    MatrB(2, 32) = Btemp(2, 10);
    MatrB(2, 35) = Btemp(2, 11);
    MatrB(2, 38) = Btemp(2, 12);
    MatrB(2, 41) = Btemp(2, 13);
    MatrB(2, 44) = Btemp(2, 14);
    MatrB(2, 47) = Btemp(2, 15);
    MatrB(2, 50) = Btemp(2, 16);
    MatrB(2, 53) = Btemp(2, 17);
    MatrB(2, 56) = Btemp(2, 18);
    MatrB(2, 59) = Btemp(2, 19);

    MatrB(3, 0) = Btemp(1, 0);
    MatrB(3, 1) = Btemp(0, 0);
    MatrB(3, 3) = Btemp(1, 1);
    MatrB(3, 4) = Btemp(0, 1);
    MatrB(3, 6) = Btemp(1, 2);
    MatrB(3, 7) = Btemp(0, 2);
    MatrB(3, 9) = Btemp(1, 3);
    MatrB(3, 10) = Btemp(0, 3);
    MatrB(3, 12) = Btemp(1, 4);
    MatrB(3, 13) = Btemp(0, 4);
    MatrB(3, 15) = Btemp(1, 5);
    MatrB(3, 16) = Btemp(0, 5);
    MatrB(3, 18) = Btemp(1, 6);
    MatrB(3, 19) = Btemp(0, 6);
    MatrB(3, 21) = Btemp(1, 7);
    MatrB(3, 22) = Btemp(0, 7);
    MatrB(3, 24) = Btemp(1, 8);
    MatrB(3, 25) = Btemp(0, 8);
    MatrB(3, 27) = Btemp(1, 9);
    MatrB(3, 28) = Btemp(0, 9);
    MatrB(3, 30) = Btemp(1, 10);
    MatrB(3, 31) = Btemp(0, 10);
    MatrB(3, 33) = Btemp(1, 11);
    MatrB(3, 34) = Btemp(0, 11);
    MatrB(3, 36) = Btemp(1, 12);
    MatrB(3, 37) = Btemp(0, 12);
    MatrB(3, 39) = Btemp(1, 13);
    MatrB(3, 40) = Btemp(0, 13);
    MatrB(3, 42) = Btemp(1, 14);
    MatrB(3, 43) = Btemp(0, 14);
    MatrB(3, 45) = Btemp(1, 15);
    MatrB(3, 46) = Btemp(0, 15);
    MatrB(3, 48) = Btemp(1, 16);
    MatrB(3, 49) = Btemp(0, 16);
    MatrB(3, 51) = Btemp(1, 17);
    MatrB(3, 52) = Btemp(0, 17);
    MatrB(3, 54) = Btemp(1, 18);
    MatrB(3, 55) = Btemp(0, 18);
    MatrB(3, 57) = Btemp(1, 19);
    MatrB(3, 58) = Btemp(0, 19);

    MatrB(4, 1) = Btemp(2, 0);
    MatrB(4, 2) = Btemp(1, 0);
    MatrB(4, 4) = Btemp(2, 1);
    MatrB(4, 5) = Btemp(1, 1);
    MatrB(4, 7) = Btemp(2, 2);
    MatrB(4, 8) = Btemp(1, 2);
    MatrB(4, 10) = Btemp(2, 3);
    MatrB(4, 11) = Btemp(1, 3);
    MatrB(4, 13) = Btemp(2, 4);
    MatrB(4, 14) = Btemp(1, 4);
    MatrB(4, 16) = Btemp(2, 5);
    MatrB(4, 17) = Btemp(1, 5);
    MatrB(4, 19) = Btemp(2, 6);
    MatrB(4, 20) = Btemp(1, 6);
    MatrB(4, 22) = Btemp(2, 7);
    MatrB(4, 23) = Btemp(1, 7);
    MatrB(4, 25) = Btemp(2, 8);
    MatrB(4, 26) = Btemp(1, 8);
    MatrB(4, 28) = Btemp(2, 9);
    MatrB(4, 29) = Btemp(1, 9);
    MatrB(4, 31) = Btemp(2, 10);
    MatrB(4, 32) = Btemp(1, 10);
    MatrB(4, 34) = Btemp(2, 11);
    MatrB(4, 35) = Btemp(1, 11);
    MatrB(4, 37) = Btemp(2, 12);
    MatrB(4, 38) = Btemp(1, 12);
    MatrB(4, 40) = Btemp(2, 13);
    MatrB(4, 41) = Btemp(1, 13);
    MatrB(4, 43) = Btemp(2, 14);
    MatrB(4, 44) = Btemp(1, 14);
    MatrB(4, 46) = Btemp(2, 15);
    MatrB(4, 47) = Btemp(1, 15);
    MatrB(4, 49) = Btemp(2, 16);
    MatrB(4, 50) = Btemp(1, 16);
    MatrB(4, 52) = Btemp(2, 17);
    MatrB(4, 53) = Btemp(1, 17);
    MatrB(4, 55) = Btemp(2, 18);
    MatrB(4, 56) = Btemp(1, 18);
    MatrB(4, 58) = Btemp(2, 19);
    MatrB(4, 59) = Btemp(1, 19);

    MatrB(5, 0) = Btemp(2, 0);
    MatrB(5, 2) = Btemp(0, 0);
    MatrB(5, 3) = Btemp(2, 1);
    MatrB(5, 5) = Btemp(0, 1);
    MatrB(5, 6) = Btemp(2, 2);
    MatrB(5, 8) = Btemp(0, 2);
    MatrB(5, 9) = Btemp(2, 3);
    MatrB(5, 11) = Btemp(0, 3);
    MatrB(5, 12) = Btemp(2, 4);
    MatrB(5, 14) = Btemp(0, 4);
    MatrB(5, 15) = Btemp(2, 5);
    MatrB(5, 17) = Btemp(0, 5);
    MatrB(5, 18) = Btemp(2, 6);
    MatrB(5, 20) = Btemp(0, 6);
    MatrB(5, 21) = Btemp(2, 7);
    MatrB(5, 23) = Btemp(0, 7);
    MatrB(5, 24) = Btemp(2, 8);
    MatrB(5, 26) = Btemp(0, 8);
    MatrB(5, 27) = Btemp(2, 9);
    MatrB(5, 29) = Btemp(0, 9);
    MatrB(5, 30) = Btemp(2, 10);
    MatrB(5, 32) = Btemp(0, 10);
    MatrB(5, 33) = Btemp(2, 11);
    MatrB(5, 35) = Btemp(0, 11);
    MatrB(5, 36) = Btemp(2, 12);
    MatrB(5, 38) = Btemp(0, 12);
    MatrB(5, 39) = Btemp(2, 13);
    MatrB(5, 41) = Btemp(0, 13);
    MatrB(5, 42) = Btemp(2, 14);
    MatrB(5, 44) = Btemp(0, 14);
    MatrB(5, 45) = Btemp(2, 15);
    MatrB(5, 47) = Btemp(0, 15);
    MatrB(5, 48) = Btemp(2, 16);
    MatrB(5, 50) = Btemp(0, 16);
    MatrB(5, 51) = Btemp(2, 17);
    MatrB(5, 53) = Btemp(0, 17);
    MatrB(5, 54) = Btemp(2, 18);
    MatrB(5, 56) = Btemp(0, 18);
    MatrB(5, 57) = Btemp(2, 19);
    MatrB(5, 59) = Btemp(0, 19);
}